

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_Dyy_leftcorner(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *in_RSI;
  int *in_RDI;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int j_3;
  int i_3;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  int iwidth;
  int iheight;
  float *data;
  int ind;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  int data_width;
  bool *laplacian;
  float *response;
  int k;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  int c11;
  int c10;
  int r11;
  int r10;
  int c01;
  int c00;
  int r01;
  int r00;
  int c1;
  int c0;
  int r1;
  int r0;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int in_stack_ffffffffffffff40;
  int rows;
  int col;
  int iVar26;
  integral_image *iimage_00;
  int local_a4;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  lVar5 = *(long *)(in_RDI + 4);
  lVar6 = *(long *)(in_RDI + 6);
  iVar13 = in_RSI[4];
  iVar2 = in_RDI[3];
  iVar26 = *in_RDI;
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[1];
  iVar10 = iVar26 / 3;
  iVar11 = (iVar26 + -1) / 2;
  fVar14 = 1.0 / (float)(iVar26 * iVar26);
  iimage_00 = *(integral_image **)(in_RSI + 2);
  iVar26 = in_RSI[1];
  col = *in_RSI;
  for (rows = 0; rows < iVar10 / 2 + 1; rows = iVar2 + rows) {
    local_a4 = (rows / iVar2) * iVar4;
    for (in_stack_ffffffffffffff40 = 0; in_stack_ffffffffffffff40 < iVar10;
        in_stack_ffffffffffffff40 = iVar2 + in_stack_ffffffffffffff40) {
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)(&iimage_00->width)
                                             [(~(iVar10 / 2) + rows + iVar10) * iVar13 +
                                              in_stack_ffffffffffffff40 + -1 + iVar10]),
                               ZEXT416((uint)(&iimage_00->width)
                                             [(rows + iVar11) * iVar13 +
                                              in_stack_ffffffffffffff40 + -1 + iVar10]));
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar20._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar20._4_60_ = extraout_var;
      auVar9 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar20._0_16_,ZEXT416((uint)fVar15));
      fVar16 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar17 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar18 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar19 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar15 = auVar9._0_4_ * fVar14;
      fVar7 = auVar8._0_4_ * fVar14;
      fVar16 = (((fVar16 + fVar17) - fVar18) - fVar19) * fVar14;
      auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(fVar16 * 0.81 * fVar16)));
      *(int *)(lVar5 + (long)local_a4 * 4) = auVar8._0_4_;
      *(byte *)(lVar6 + local_a4) = (fVar15 + fVar7 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_c4 = ((iVar10 / 2 + iVar2) / iVar2) * iVar2; local_c4 < iVar11 + 1;
      local_c4 = iVar2 + local_c4) {
    local_a4 = (local_c4 / iVar2) * iVar4;
    for (local_c8 = 0; local_c8 < iVar10; local_c8 = iVar2 + local_c8) {
      iVar12 = ~(iVar10 / 2) + local_c4;
      iVar1 = local_c8 + -1 + iVar10;
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)((float)(&iimage_00->width)
                                                     [(iVar12 + iVar10) * iVar13 + iVar1] -
                                             (float)(&iimage_00->width)[iVar12 * iVar13 + iVar1])),
                               ZEXT416((uint)(&iimage_00->width)
                                             [(local_c4 + iVar11) * iVar13 + local_c8 + -1 + iVar10]
                                      ));
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar21._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar21._4_60_ = extraout_var_00;
      auVar9 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar21._0_16_,ZEXT416((uint)fVar15));
      fVar16 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar17 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar18 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar19 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar15 = auVar9._0_4_ * fVar14;
      fVar7 = auVar8._0_4_ * fVar14;
      fVar16 = (((fVar16 + fVar17) - fVar18) - fVar19) * fVar14;
      auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(fVar16 * 0.81 * fVar16)));
      *(int *)(lVar5 + (long)local_a4 * 4) = auVar8._0_4_;
      *(byte *)(lVar6 + local_a4) = (fVar15 + fVar7 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  iVar13 = ((iVar10 + iVar2 + -1) / iVar2) * iVar2;
  for (local_cc = 0; local_cc < iVar11 + 1; local_cc = iVar2 + local_cc) {
    local_a4 = (local_cc / iVar2) * iVar4 + iVar13 / iVar2;
    for (local_d0 = iVar13; local_d0 < iVar4 * iVar2; local_d0 = iVar2 + local_d0) {
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar22._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar22._4_60_ = extraout_var_01;
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar22._0_16_,ZEXT416((uint)fVar15));
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar23._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar23._4_60_ = extraout_var_02;
      auVar9 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar23._0_16_,ZEXT416((uint)fVar15));
      fVar16 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar17 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar18 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar19 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar15 = auVar8._0_4_ * fVar14;
      fVar7 = auVar9._0_4_ * fVar14;
      fVar16 = (((fVar16 + fVar17) - fVar18) - fVar19) * fVar14;
      auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(fVar16 * 0.81 * fVar16)));
      *(int *)(lVar5 + (long)local_a4 * 4) = auVar8._0_4_;
      *(byte *)(lVar6 + local_a4) = (fVar15 + fVar7 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  for (local_d4 = ((iVar11 + iVar2) / iVar2) * iVar2; local_d4 < iVar3 * iVar2;
      local_d4 = iVar2 + local_d4) {
    local_a4 = (local_d4 / iVar2) * iVar4;
    for (local_d8 = 0; local_d8 < iVar4 * iVar2; local_d8 = iVar2 + local_d8) {
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar24._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar24._4_60_ = extraout_var_03;
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar24._0_16_,ZEXT416((uint)fVar15));
      fVar15 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar25._0_4_ = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      auVar25._4_60_ = extraout_var_04;
      auVar9 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar25._0_16_,ZEXT416((uint)fVar15));
      fVar16 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar17 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar18 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar19 = box_integral(iimage_00,iVar26,col,rows,in_stack_ffffffffffffff40);
      fVar15 = auVar8._0_4_ * fVar14;
      fVar7 = auVar9._0_4_ * fVar14;
      fVar16 = (((fVar16 + fVar17) - fVar18) - fVar19) * fVar14;
      auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(fVar16 * 0.81 * fVar16)));
      *(int *)(lVar5 + (long)local_a4 * 4) = auVar8._0_4_;
      *(byte *)(lVar6 + local_a4) = (fVar15 + fVar7 < 0.0) - 1U & 1;
      local_a4 = local_a4 + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_leftcorner(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer

        optimization:
        - Dyy box filter hand optimized and split into cases (here only leftcorner)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1;
    float A, B, C, D;
    int k;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];  // seg fault at: i: 12, j:0

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = 0; i < border + 1; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // printf("OPTIMIZED: (%i, %i) - Dyy: %f, Dxx: %f, Dxy: %f\n\n", i, j, Dyy, Dxx, Dxy);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}